

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O2

size_t __thiscall FSSDataModel::addDataSource(FSSDataModel *this,DataSourceType type,QString *path)

{
  int iVar1;
  size_t sVar2;
  FSSDataModel *this_00;
  PSource source;
  __shared_ptr<DataSourceAmiga,_(__gnu_cxx::_Lock_policy)2> local_60;
  QArrayDataPointer<char> local_50;
  char *local_38;
  __shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined1 local_20 [16];
  
  source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar2 = 0xffffffffffffffff;
  if (type == DataSourceTypeCustom) {
    QString::toLocal8Bit((QByteArray *)&local_50,path);
    local_38 = QByteArray::data((QByteArray *)&local_50);
    std::make_shared<DataSourceCustom,char*>((char **)&local_60);
    std::__shared_ptr<Data::Source,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Data::Source,(__gnu_cxx::_Lock_policy)2> *)&source,
               (__shared_ptr<DataSourceCustom,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
  }
  else if (type == DataSourceTypeAmiga) {
    QString::toLocal8Bit((QByteArray *)&local_50,path);
    local_38 = QByteArray::data((QByteArray *)&local_50);
    std::make_shared<DataSourceAmiga,char*>((char **)&local_60);
    std::__shared_ptr<Data::Source,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Data::Source,(__gnu_cxx::_Lock_policy)2> *)&source,&local_60);
  }
  else {
    if (type != DataSourceTypeDos) goto LAB_0011cc66;
    QString::toLocal8Bit((QByteArray *)&local_50,path);
    local_38 = QByteArray::data((QByteArray *)&local_50);
    std::make_shared<DataSourceDOS,char*>((char **)&local_60);
    std::__shared_ptr<Data::Source,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Data::Source,(__gnu_cxx::_Lock_policy)2> *)&source,
               (__shared_ptr<DataSourceDOS,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  if (source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar1 = (*(source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Source[6])();
    if ((char)iVar1 != '\0') {
      this_00 = (FSSDataModel *)local_20;
      std::__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> *)local_20,
                 &source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>);
      saveSetting(this_00,(PSource *)local_20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
      std::__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_30,&source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>);
      sVar2 = addDataSource(this,(PSource *)&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    }
  }
LAB_0011cc66:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return sVar2;
}

Assistant:

size_t
FSSDataModel::addDataSource(DataSourceType type, const QString &path) {
  Data::PSource source;

  switch (type) {
    case DataSourceTypeDos:
      source = std::make_shared<DataSourceDOS>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeAmiga:
      source = std::make_shared<DataSourceAmiga>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeCustom:
      source = std::make_shared<DataSourceCustom>(path.toLocal8Bit().data());
      break;
  }

  if (source && source->load()) {
    saveSetting(source);
    return addDataSource(source);
  }

  return std::numeric_limits<size_t>::max();
}